

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O3

long test_data_callback(cubeb_stream *stm,void *user_ptr,void *param_3,void *outputbuffer,
                       long nframes)

{
  char *in_R9;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  string local_48;
  
  local_68[0] = (internal)
                (0 < nframes &&
                ((outputbuffer != (void *)0x0 && stm != (cubeb_stream *)0x0) &&
                (int *)user_ptr == &dummy));
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (0 >= nframes ||
      ((outputbuffer == (void *)0x0 || stm == (cubeb_stream *)0x0) || (int *)user_ptr != &dummy)) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,local_68,
               (AssertionResult *)"stm && user_ptr == &dummy && outputbuffer && nframes > 0","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_sanity.cpp"
               ,0x43,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  memset(outputbuffer,0,nframes * 2);
  LOCK();
  total_frames_written.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)total_frames_written.super___atomic_base<unsigned_long>._M_i + nframes);
  UNLOCK();
  if (delay_callback == '\x01') {
    sleep(0);
    usleep(10000);
  }
  return nframes;
}

Assistant:

static long
test_data_callback(cubeb_stream * stm, void * user_ptr,
                   const void * /*inputbuffer*/, void * outputbuffer,
                   long nframes)
{
  EXPECT_TRUE(stm && user_ptr == &dummy && outputbuffer && nframes > 0);
  assert(outputbuffer);
  memset(outputbuffer, 0, nframes * sizeof(short));

  total_frames_written += nframes;
  if (delay_callback) {
    delay(10);
  }
  return nframes;
}